

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

void __thiscall ON_Outline::SortFigures(ON_Outline *this,Orientation outer_loop_orientation)

{
  ON_OutlineFigure **ppOVar1;
  int iVar2;
  ON_OutlineFigure *pOVar3;
  Orientation OVar4;
  bool bVar5;
  uint uVar6;
  ON_OutlineFigure *pOVar7;
  ulong uVar8;
  uint k0;
  size_t c;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  Orientation OVar12;
  uint j;
  ulong uVar13;
  double x;
  ON_OutlineFigure *parent_outer_figure;
  ON_OutlineFigure *f;
  ON_SimpleArray<ON_OutlineFigure_*> sorted_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures;
  ON_SimpleArray<ON_OutlineFigure_*> inner_figures_parent;
  ON_SimpleArray<ON_OutlineFigure_*> ignored_figures;
  ON_SimpleArray<ON_OutlineFigure_*> outer_figures;
  
  if ((0xfd < (byte)(outer_loop_orientation - NotOriented)) &&
     (this->m_sorted_figure_outer_orientation != Error &&
      this->m_sorted_figure_outer_orientation != outer_loop_orientation)) {
    this->m_sorted_figure_outer_orientation = outer_loop_orientation;
    iVar2 = (this->m_figures).m_count;
    c = (size_t)iVar2;
    if (0 < (long)c) {
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray(&sorted_figures,c);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray(&ignored_figures,c);
      OVar12 = Clockwise - (outer_loop_orientation == Clockwise);
      for (lVar9 = 0; c * 0x48 - lVar9 != 0; lVar9 = lVar9 + 0x48) {
        pOVar7 = (this->m_figures).m_a;
        inner_figures._vptr_ON_SimpleArray = (_func_int **)((long)&pOVar7->m_units_per_em + lVar9);
        uVar6 = (uint)(&pOVar7->m_figure_type)[lVar9];
        if ((uVar6 < 5) && ((0x13U >> (uVar6 & 0x1f) & 1) != 0)) {
          x = ON_OutlineFigure::AreaEstimate((ON_OutlineFigure *)inner_figures._vptr_ON_SimpleArray)
          ;
          ON_OutlineFigure::BoundingBox
                    ((ON_BoundingBox *)&outer_figures,
                     (ON_OutlineFigure *)inner_figures._vptr_ON_SimpleArray);
          OVar4 = ON_OutlineFigure::FigureOrientation
                            ((ON_OutlineFigure *)inner_figures._vptr_ON_SimpleArray);
          if (((x == 0.0) && (!NAN(x))) ||
             ((((bVar5 = ON_IsValid(x), !bVar5 ||
                (bVar5 = ON_BoundingBox::IsNotEmpty((ON_BoundingBox *)&outer_figures), !bVar5)) ||
               (bVar5 = ON_BoundingBox::IsPoint((ON_BoundingBox *)&outer_figures), bVar5)) ||
              (OVar4 != outer_loop_orientation && OVar12 != OVar4)))) {
            *(undefined1 *)((long)inner_figures._vptr_ON_SimpleArray + 5) = 5;
            goto LAB_004acad4;
          }
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    (&sorted_figures,(ON_OutlineFigure **)&inner_figures);
        }
        else {
LAB_004acad4:
          ON_SimpleArray<ON_OutlineFigure_*>::Append
                    (&ignored_figures,(ON_OutlineFigure **)&inner_figures);
        }
      }
      uVar13 = (ulong)(uint)sorted_figures.m_count;
      ON_SimpleArray<ON_OutlineFigure_*>::QuickSort(&sorted_figures,Internal_CompareAreaEstimate);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray(&outer_figures,uVar13);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray(&inner_figures,uVar13);
      ON_SimpleArray<ON_OutlineFigure_*>::ON_SimpleArray(&inner_figures_parent,uVar13);
      for (uVar8 = 0; uVar8 != uVar13; uVar8 = uVar8 + 1) {
        f = sorted_figures.m_a[uVar8];
        parent_outer_figure = (ON_OutlineFigure *)0x0;
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          pOVar7 = sorted_figures.m_a[uVar10];
          bVar5 = ON_OutlineFigure::IsInsideOf(f,pOVar7,false);
          pOVar3 = parent_outer_figure;
          if (((bVar5) &&
              (OVar4 = ON_OutlineFigure::FigureOrientation(pOVar7), pOVar3 = pOVar7,
              OVar4 != outer_loop_orientation)) &&
             (OVar4 = ON_OutlineFigure::FigureOrientation(pOVar7), pOVar3 = parent_outer_figure,
             OVar12 == OVar4)) {
            parent_outer_figure = (ON_OutlineFigure *)0x0;
            pOVar3 = parent_outer_figure;
          }
          parent_outer_figure = pOVar3;
        }
        if (parent_outer_figure == (ON_OutlineFigure *)0x0) {
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&outer_figures,&f);
          OVar4 = ON_OutlineFigure::FigureOrientation(f);
          if (OVar12 == OVar4) goto LAB_004acbf5;
        }
        else {
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&inner_figures,&f);
          ON_SimpleArray<ON_OutlineFigure_*>::Append(&inner_figures_parent,&parent_outer_figure);
          OVar4 = ON_OutlineFigure::FigureOrientation(f);
          if (OVar4 == outer_loop_orientation) {
LAB_004acbf5:
            ON_OutlineFigure::ReverseFigure(f);
          }
        }
      }
      if ((ulong)(uint)outer_figures.m_count == 0) {
        this->m_sorted_figure_outer_orientation = Error;
      }
      else if ((ulong)(uint)inner_figures.m_count != 0) {
        if (-1 < sorted_figures.m_capacity) {
          sorted_figures.m_count = 0;
        }
        for (uVar8 = 0; uVar8 != (uint)outer_figures.m_count; uVar8 = uVar8 + 1) {
          f = outer_figures.m_a[uVar8];
          if (f != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&sorted_figures,&f);
            for (uVar13 = 0; (uint)inner_figures.m_count != uVar13; uVar13 = uVar13 + 1) {
              if (f == inner_figures_parent.m_a[uVar13]) {
                parent_outer_figure = inner_figures.m_a[uVar13];
                inner_figures.m_a[uVar13] = (ON_OutlineFigure *)0x0;
                inner_figures_parent.m_a[uVar13] = (ON_OutlineFigure *)0x0;
                if (parent_outer_figure != (ON_OutlineFigure *)0x0) {
                  ON_SimpleArray<ON_OutlineFigure_*>::Append(&sorted_figures,&parent_outer_figure);
                }
              }
            }
          }
        }
        for (uVar8 = 0; uVar8 < (uint)ignored_figures.m_count; uVar8 = uVar8 + 1) {
          f = ignored_figures.m_a[uVar8];
          if (f != (ON_OutlineFigure *)0x0) {
            ON_SimpleArray<ON_OutlineFigure_*>::Append(&sorted_figures,&f);
          }
        }
        if (sorted_figures.m_count == iVar2) {
          pOVar7 = (this->m_figures).m_a + -1;
          sVar11 = 0;
          do {
            if (c == sVar11) goto LAB_004acd92;
            pOVar7 = pOVar7 + 1;
            ppOVar1 = sorted_figures.m_a + sVar11;
            sVar11 = sVar11 + 1;
          } while (pOVar7 == *ppOVar1);
          ON_ClassArray<ON_OutlineFigure>::ON_ClassArray((ON_ClassArray<ON_OutlineFigure> *)&f,c);
          for (sVar11 = 0; c != sVar11; sVar11 = sVar11 + 1) {
            ON_ClassArray<ON_OutlineFigure>::Append
                      ((ON_ClassArray<ON_OutlineFigure> *)&f,sorted_figures.m_a[sVar11]);
          }
          ON_ClassArray<ON_OutlineFigure>::operator=
                    (&this->m_figures,(ON_ClassArray<ON_OutlineFigure> *)&f);
          ON_ClassArray<ON_OutlineFigure>::~ON_ClassArray((ON_ClassArray<ON_OutlineFigure> *)&f);
        }
      }
LAB_004acd92:
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&inner_figures_parent);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&inner_figures);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&outer_figures);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&ignored_figures);
      ON_SimpleArray<ON_OutlineFigure_*>::~ON_SimpleArray(&sorted_figures);
    }
  }
  return;
}

Assistant:

void ON_Outline::SortFigures(
  ON_OutlineFigure::Orientation outer_loop_orientation
)
{
  if (
    ON_OutlineFigure::Orientation::Clockwise != outer_loop_orientation
    && ON_OutlineFigure::Orientation::CounterClockwise != outer_loop_orientation
    )
    return;

  if (outer_loop_orientation == m_sorted_figure_outer_orientation)
    return;

  if (ON_OutlineFigure::Orientation::Error == m_sorted_figure_outer_orientation)
    return; // not sortable

   m_sorted_figure_outer_orientation = outer_loop_orientation;

  const int figure_count = m_figures.Count();
  if (figure_count <= 0)
    return;

  const ON_OutlineFigure::Orientation inner_loop_orientation
    = (ON_OutlineFigure::Orientation::Clockwise == outer_loop_orientation)
    ? ON_OutlineFigure::Orientation::CounterClockwise
    : ON_OutlineFigure::Orientation::Clockwise;

  ON_SimpleArray<ON_OutlineFigure*> sorted_figures(figure_count);
  ON_SimpleArray<ON_OutlineFigure*> ignored_figures(figure_count);

  for (int i = 0; i < figure_count; i++)
  {
    ON_OutlineFigure* ptr = &m_figures[i];
    if (
      (ON_OutlineFigure::Type::Perimeter == ptr->FigureType()
        || ON_OutlineFigure::Type::Unknown == ptr->FigureType()
        || ON_OutlineFigure::Type::Unset == ptr->FigureType())
      )
    {
      const double figure_area = ptr->AreaEstimate();
      const ON_BoundingBox figure_bbox = ptr->BoundingBox();
      const ON_OutlineFigure::Orientation figure_orientation = ptr->FigureOrientation();

      if (
        0.0 != figure_area && ON_IsValid(figure_area)
        && figure_bbox.IsNotEmpty() && false == figure_bbox.IsPoint()
        && (outer_loop_orientation == figure_orientation
          || inner_loop_orientation == figure_orientation)
        )
      {
        sorted_figures.Append(ptr);
        continue;
      }

      // Mark this figure has NotPerimeter because something about
      // its path is not valid. This will prevent it from being 
      // used in meshing.
      ptr->m_figure_type = ON_OutlineFigure::Type::NotPerimeter;
    }

    // ignored figures are ones that are not a perimeter of an inner
    // or outer boundary.
    ignored_figures.Append(ptr);
  }

  const unsigned int sorted_figure_count = sorted_figures.UnsignedCount();

  // Sort figures so the ones with largest included area are first.
  sorted_figures.QuickSort(Internal_CompareAreaEstimate);

  // As we look at each element of sorted_figures[], it gets assigned to
  // outer_figures[] or inner_figures[]. If it is assigned to inner_figures[],
  // the smallest figure that contains it is assigned to inner_figures_parent[].
  //
  // Over the years, many more complicated approaches to sorting were tried,
  // all of which attempted to take into account the orientations from the font file. 
  // It is so common for the orientations in the font files to be wrong, 
  // that ignoring them is the most efficient and reliable approach to date.
  // It is extremly common for outer figures to overlap.
  ON_SimpleArray<ON_OutlineFigure*> outer_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures(sorted_figure_count);
  ON_SimpleArray<ON_OutlineFigure*> inner_figures_parent(sorted_figure_count);

  for (  unsigned k = 0; k < sorted_figure_count; ++k)
  {
    ON_OutlineFigure* f = sorted_figures[k];

    // This for(int k0; ...) loop finds the smallest larger figure that contains f and uses
    // the orientation of this containing loop to determine the orientation of f.
    ON_OutlineFigure* parent_outer_figure = nullptr;
    for (unsigned k0 = 0; k0 < k; ++k0)
    {
      // Given our assumptions, it is impossible for bigger_f to be inside of f.
      ON_OutlineFigure* bigger_f = sorted_figures[k0];
      if (false == f->IsInsideOf(bigger_f, false))
        continue;

      if (outer_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an outer loop.
        parent_outer_figure = bigger_f;
      }
      else if (inner_loop_orientation == bigger_f->FigureOrientation())
      {
        // f is inside of bigger_f and bigger_f is an inner loop.
        // So f is a nested outer (like the registered trademark glyph)
        parent_outer_figure = nullptr;
      }
    }

    if (nullptr == parent_outer_figure)
    {
      outer_figures.Append(f);
      if (inner_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an outer.
        f->ReverseFigure();
      }
    }
    else
    {
      inner_figures.Append(f);
      inner_figures_parent.Append(parent_outer_figure);
      if (outer_loop_orientation == f->FigureOrientation())
      {
        // convert this figure to an inner
        f->ReverseFigure();
      }
    }
  }

  const unsigned outer_count = outer_figures.UnsignedCount();
  const unsigned inner_count = inner_figures.UnsignedCount();

  if ( 0 == outer_count )
  {
    m_sorted_figure_outer_orientation = ON_OutlineFigure::Orientation::Error;
    return;
  }

  if (0 == inner_count)
  {
    return;
  }

  // Sort figures by outer followed by its inners.
  sorted_figures.SetCount(0);
    for (unsigned i = 0; i < outer_count; ++i)
  {
    ON_OutlineFigure* outer_figure = outer_figures[i];
    if (nullptr == outer_figure)
      continue;
    sorted_figures.Append(outer_figure);
    for (unsigned j = 0; j < inner_count; ++j)
    {
      if (outer_figure == inner_figures_parent[j])
      {
        ON_OutlineFigure* inner_figure = inner_figures[j];
        inner_figures[j] = nullptr;
        inner_figures_parent[j] = nullptr;
        if (nullptr != inner_figure)
          sorted_figures.Append(inner_figure);
      }
    }
  }

  // Put single stroke and other non-perimeter figures on the end.
  for (unsigned int k = 0; k < ignored_figures.UnsignedCount(); k++)
  {
    ON_OutlineFigure* f = ignored_figures[k];
    if (nullptr != f)
      sorted_figures.Append(f);
  }

  if (sorted_figures.Count() == figure_count)
  {
    for (int k = 0; k < figure_count; k++)
    {
      if (sorted_figures[k] != &m_figures[k])
      {
        // Need to reorder m_figures[] array
        ON_ClassArray<ON_OutlineFigure> tmp(figure_count);
        for (int i = 0; i < figure_count; i++)
        {
          tmp.Append(*sorted_figures[i]);
        }
        m_figures = tmp;
        break;
      }
    }
  }

  return;
}